

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeHistogram.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeHistogram::writeCharge(ChargeHistogram *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"ChargeHistogram: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#Charges for selection\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#nFrames:\t",10);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->nProcessed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Bin_center",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\tcount\n",7);
    if ((this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->histList_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>
                           ((this->bincenter_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->histList_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar4 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar4 < (ulong)((long)(this->histList_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->histList_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ChargeHistogram::writeCharge() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#Charges for selection\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#"
                << "Bin_center"
                << "\tcount\n";
      for (unsigned int i = 0; i < histList_.size(); ++i) {
        rdfStream << bincenter_[i] << "\t" << histList_[i] << "\n";
      }
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeHistogram: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    rdfStream.close();
  }